

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void wstran_listener_match(ws_listener *l)

{
  nni_aio *aio;
  void *item;
  
  aio = (nni_aio *)nni_list_first(&l->aios);
  if (aio != (nni_aio *)0x0) {
    item = nni_list_first(&l->wait_pipes);
    if (item != (void *)0x0) {
      nni_list_remove(&l->wait_pipes,item);
      nni_aio_list_remove(aio);
      nni_aio_set_output(aio,0,*(void **)((long)item + 0x3d8));
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
  }
  return;
}

Assistant:

static void
wstran_listener_match(ws_listener *l)
{
	nni_aio *uaio;
	ws_pipe *p;
	if (((uaio = nni_list_first(&l->aios)) == NULL) ||
	    ((p = nni_list_first(&l->wait_pipes)) == NULL)) {
		return;
	}

	nni_list_remove(&l->wait_pipes, p);
	nni_aio_list_remove(uaio);

	nni_aio_set_output(uaio, 0, p->npipe);
	nni_aio_finish(uaio, 0, 0);
}